

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,half *v)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(local_190,(half *)this);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::value::half &v) {
  std::stringstream ss;
  ss << v;
  return ss.str();
}